

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

string * __thiscall
bloaty::(anonymous_namespace)::DoubleStringPrintf_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *fmt,double d)

{
  char buf [1024];
  allocator<char> local_419;
  char local_418 [1032];
  
  snprintf(local_418,0x400,(char *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_418,&local_419);
  return __return_storage_ptr__;
}

Assistant:

std::string DoubleStringPrintf(const char* fmt, double d) {
  char buf[1024];
  snprintf(buf, sizeof(buf), fmt, d);
  return std::string(buf);
}